

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormTests.cpp
# Opt level: O0

void __thiscall MockUserCreateForm::clean(MockUserCreateForm *this)

{
  bool bVar1;
  ulong uVar2;
  map<int,_BaseUser,_std::less<int>,_std::allocator<std::pair<const_int,_BaseUser>_>_> *this_00;
  char *__lhs;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  reference local_b8;
  pair<const_int,_BaseUser> *it;
  iterator __end1;
  iterator __begin1;
  map<int,_BaseUser,_std::less<int>,_std::allocator<std::pair<const_int,_BaseUser>_>_> *__range1;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  MockUserCreateForm *local_10;
  MockUserCreateForm *this_local;
  
  local_10 = this;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) || (uVar2 = std::__cxx11::string::size(), 0x20 < uVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"invalid first name length",&local_31);
    Form::addError((Form *)this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) || (uVar2 = std::__cxx11::string::size(), 0x40 < uVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"invalid last name length",&local_69);
    Form::addError((Form *)this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) || (uVar2 = std::__cxx11::string::size(), 0x40 < uVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_90,"invalid first name length",(allocator *)((long)&__range1 + 7));
    Form::addError((Form *)this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  }
  this_00 = Model<BaseUser>::all();
  __end1 = std::map<int,_BaseUser,_std::less<int>,_std::allocator<std::pair<const_int,_BaseUser>_>_>
           ::begin(this_00);
  it = (pair<const_int,_BaseUser> *)
       std::map<int,_BaseUser,_std::less<int>,_std::allocator<std::pair<const_int,_BaseUser>_>_>::
       end(this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&it), bVar1) {
    local_b8 = std::_Rb_tree_iterator<std::pair<const_int,_BaseUser>_>::operator*(&__end1);
    __lhs = BaseUser::getEmail(&local_b8->second);
    bVar1 = std::operator==(__lhs,&this->email);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d8,"A user with this email already exists",&local_d9);
      Form::addError((Form *)this,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_BaseUser>_>::operator++(&__end1);
  }
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) || (uVar2 = std::__cxx11::string::size(), 0x40 < uVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"invalid password length",&local_101);
    Form::addError((Form *)this,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  return;
}

Assistant:

void MockUserCreateForm::clean() {

    if (firstName.empty() || firstName.size() > 32) addError("invalid first name length");
    if (lastName.empty() || lastName.size() > 64) addError("invalid last name length");
    if (email.empty() || email.size() > 64) addError("invalid first name length");
    for (auto &it : BaseUser::all()) {
        if (it.second.getEmail() == email) addError("A user with this email already exists");
    }
    if (password.empty() || password.size() > 64) addError("invalid password length");
}